

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Processor *p)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  ulong uVar8;
  
  ppVar1 = (p->super_ProcessorBase).endpoints.
           super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->super_ProcessorBase).endpoints.
      super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar1[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar1 = (p->super_ProcessorBase).endpoints.
               super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->super_ProcessorBase).endpoints.
                                   super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3));
  }
  ppVar2 = (p->super_ProcessorBase).super_ModuleBase.structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->super_ProcessorBase).super_ModuleBase.structures.
      super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,ppVar2[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar2 = (p->super_ProcessorBase).super_ModuleBase.structures.
               super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->super_ProcessorBase).super_ModuleBase.structures.
                                   super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3));
  }
  ppVar3 = (p->super_ProcessorBase).super_ModuleBase.usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->super_ProcessorBase).super_ModuleBase.usings.
      super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,ppVar3[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar3 = (p->super_ProcessorBase).super_ModuleBase.usings.
               super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->super_ProcessorBase).super_ModuleBase.usings.
                                   super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3));
  }
  ppVar4 = (p->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->stateVariables).
      super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[4])(this,ppVar4[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar4 = (p->stateVariables).
               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->stateVariables).
                                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3));
  }
  if ((p->latency).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  ppVar5 = (p->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->functions).
      super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar5[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar5 = (p->functions).
               super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->functions).
                                   super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 3));
  }
  ppVar6 = (p->super_ProcessorBase).super_ModuleBase.namespaceAliases.
           super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->super_ProcessorBase).super_ModuleBase.namespaceAliases.
      super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar6[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar6 = (p->super_ProcessorBase).super_ModuleBase.namespaceAliases.
               super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->super_ProcessorBase).super_ModuleBase.namespaceAliases.
                                   super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3));
  }
  ppVar7 = (p->super_ProcessorBase).super_ModuleBase.staticAssertions.
           super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((p->super_ProcessorBase).super_ModuleBase.staticAssertions.
      super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    uVar8 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,ppVar7[uVar8].object);
      uVar8 = uVar8 + 1;
      ppVar7 = (p->super_ProcessorBase).super_ModuleBase.staticAssertions.
               super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(p->super_ProcessorBase).super_ModuleBase.staticAssertions.
                                   super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 3));
  }
  return;
}

Assistant:

virtual void visit (AST::Processor& p)
    {
        visitArray (p.endpoints);
        visitArray (p.structures);
        visitArray (p.usings);
        visitArray (p.stateVariables);
        visitObjectIfNotNull (p.latency);
        visitArray (p.functions);
        visitArray (p.namespaceAliases);
        visitArray (p.staticAssertions);
    }